

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O1

int getDeviceType(uint devNumber)

{
  int iVar1;
  void *__ptr;
  size_t sVar2;
  long lVar3;
  uint uVar4;
  char *pcVar5;
  DWORD numDevs;
  string boardDescription;
  uint local_4c;
  long *local_48 [2];
  long local_38 [2];
  
  local_4c = 0;
  iVar1 = FT_CreateDeviceInfoList();
  if (iVar1 == 0) {
    if (devNumber < local_4c) {
      __ptr = malloc((ulong)local_4c * 0x68);
      iVar1 = FT_GetDeviceInfoList(__ptr,&local_4c);
      if (iVar1 == 0) {
        pcVar5 = (char *)((long)__ptr + (ulong)devNumber * 0x68 + 0x20);
        local_48[0] = local_38;
        sVar2 = strlen(pcVar5);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,pcVar5,(long)__ptr + sVar2 + (ulong)devNumber * 0x68 + 0x20);
        iVar1 = std::__cxx11::string::compare((char *)local_48);
        if (iVar1 == 0) {
          uVar4 = 2;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)local_48);
          if (iVar1 == 0) {
            uVar4 = 0;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)local_48);
            uVar4 = -(uint)(iVar1 != 0) | 1;
          }
        }
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error getting device list!",0x1a);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
        std::ostream::put(-0x38);
        std::ostream::flush();
        uVar4 = 0xfffffffe;
      }
      free(__ptr);
      return uVar4;
    }
    pcVar5 = "Invalid device number!";
    lVar3 = 0x16;
  }
  else {
    pcVar5 = "Could not read device list!";
    lVar3 = 0x1b;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  return -2;
}

Assistant:

int getDeviceType(unsigned int devNumber) {
    FT_STATUS ftStatus;
    FT_DEVICE_LIST_INFO_NODE *devInfo;
    DWORD numDevs = 0;
    int board = BOARD_ERROR;
    // create the device information list
    ftStatus = FT_CreateDeviceInfoList(&numDevs);
    if (ftStatus != FT_OK) {
        cerr << "Could not read device list!" << endl;
        return BOARD_ERROR;
    }

    if (numDevs <= devNumber) {
        cerr << "Invalid device number!" << endl;
        return BOARD_ERROR;
    }

    // allocate storage for list based on numDevs
    devInfo = (FT_DEVICE_LIST_INFO_NODE *) malloc(
            sizeof(FT_DEVICE_LIST_INFO_NODE) * numDevs);
    // get the device information list
    ftStatus = FT_GetDeviceInfoList(devInfo, &numDevs);
    if (ftStatus == FT_OK) {
        string boardDescription = devInfo[devNumber].Description;
        if (boardDescription == "Alchitry Cu A") {
            board = BOARD_CU;
        } else if (boardDescription == "Alchitry Au A") {
            board = BOARD_AU;
        } else if (boardDescription == "Alchitry Au+ A") {
            board = BOARD_AU_PLUS;
        } else {
            board = BOARD_UNKNOWN;
        }
    } else {
        cerr << "Error getting device list!" << endl;
    }
    free(devInfo);

    return board;
}